

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O2

void * going_malloc(size_t size)

{
  FILE *__stream;
  void *pvVar1;
  int *piVar2;
  char *pcVar3;
  
  pvVar1 = malloc(size);
  __stream = _stderr;
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    pcVar3 = "None";
  }
  else {
    pcVar3 = strerror(*piVar2);
  }
  fprintf(__stream,"[ERROR] (%s:%d: errno: %s) going_malloc failed.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
          ,0x1b0,pcVar3);
  exit(-1);
}

Assistant:

void *going_malloc(size_t size)
{
	void *ptr = malloc(size);
	if(NULL == ptr){
		log_err("going_malloc failed.");
		exit(-1);
	}
	return ptr;
}